

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O3

void __thiscall xmrig::OclCnRunner::build(OclCnRunner *this)

{
  OclKernel *this_00;
  Cn1Kernel *this_01;
  CnBranchKernel *this_02;
  size_t i;
  size_t index;
  
  OclBaseRunner::build(&this->super_OclBaseRunner);
  this_00 = (OclKernel *)operator_new(0x20);
  OclKernel::OclKernel(this_00,(this->super_OclBaseRunner).m_program,"cn2");
  this_00->_vptr_OclKernel = (_func_int **)&PTR__OclKernel_001ad348;
  this->m_cn2 = (Cn2Kernel *)this_00;
  Cn2Kernel::setArgs((Cn2Kernel *)this_00,this->m_scratchpads,this->m_states,&this->m_branches,
                     (this->super_OclBaseRunner).m_intensity);
  this_01 = (Cn1Kernel *)operator_new(0x20);
  Cn1Kernel::Cn1Kernel(this_01,(this->super_OclBaseRunner).m_program);
  this->m_cn1 = this_01;
  Cn1Kernel::setArgs(this_01,(this->super_OclBaseRunner).m_input,this->m_scratchpads,this->m_states,
                     (this->super_OclBaseRunner).m_intensity);
  index = 0;
  do {
    this_02 = (CnBranchKernel *)operator_new(0x20);
    CnBranchKernel::CnBranchKernel(this_02,index,(this->super_OclBaseRunner).m_program);
    CnBranchKernel::setArgs
              (this_02,this->m_states,
               (this->m_branches).super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>._M_impl.
               super__Vector_impl_data._M_start[index],(this->super_OclBaseRunner).m_output,
               (this->super_OclBaseRunner).m_intensity);
    (this->m_branchKernels).
    super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>._M_impl.
    super__Vector_impl_data._M_start[index] = this_02;
    index = index + 1;
  } while (index != 4);
  return;
}

Assistant:

void xmrig::OclCnRunner::build()
{
    OclBaseRunner::build();

    m_cn2 = new Cn2Kernel(m_program);
    m_cn2->setArgs(m_scratchpads, m_states, m_branches, m_intensity);

    m_cn1 = new Cn1Kernel(m_program);
    m_cn1->setArgs(m_input, m_scratchpads, m_states, m_intensity);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        auto kernel = new CnBranchKernel(i, m_program);
        kernel->setArgs(m_states, m_branches[i], m_output, m_intensity);

        m_branchKernels[i] = kernel;
    }
}